

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

unsigned_short * __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::reentrant_consume_operation::element<unsigned_short>(reentrant_consume_operation *this)

{
  LfQueueControl *i_control;
  bool bVar1;
  runtime_type<> *this_00;
  unsigned_short *puVar2;
  reentrant_consume_operation *this_local;
  
  bVar1 = empty(this);
  if (!bVar1) {
    this_00 = complete_type(this);
    bVar1 = runtime_type<>::is<unsigned_short>(this_00);
    if (bVar1) goto LAB_02517e30;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
             ,0xa3f);
LAB_02517e30:
  i_control = (this->m_consume_data).m_control;
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
          ::Consume::external(&this->m_consume_data);
  puVar2 = (unsigned_short *)
           detail::
           LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
           ::get_element(i_control,bVar1);
  return puVar2;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                DENSITY_ASSERT(!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>());
                return *static_cast<COMPLETE_ELEMENT_TYPE *>(
                  Base::get_element(m_consume_data.m_control, m_consume_data.external()));
            }